

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O0

void Hacl_Hash_MD5_update_last(uint32_t *s,uint64_t prev_len,uint8_t *input,uint32_t input_len)

{
  uint n_blocks;
  uint uVar1;
  uint8_t *tmp_pad;
  uint8_t *tmp_rest;
  uint8_t *tmp;
  uint8_t tmp_twoblocks [128];
  uint32_t tmp_len;
  uint32_t pad_len;
  uint64_t total_input_len;
  uint8_t *rest;
  uint32_t rest_len;
  uint8_t *blocks;
  uint32_t blocks_len;
  uint32_t blocks_n;
  uint32_t input_len_local;
  uint8_t *input_local;
  uint64_t prev_len_local;
  uint32_t *s_local;
  
  n_blocks = input_len >> 6;
  uVar1 = input_len + n_blocks * -0x40;
  Hacl_Hash_MD5_update_multi(s,input,n_blocks);
  tmp_twoblocks._124_4_ = (0x80 - (((uint)(prev_len + input_len) & 0x3f) + 9) & 0x3f) + 9;
  tmp_twoblocks._120_4_ = uVar1 + tmp_twoblocks._124_4_;
  memset(&tmp,0,0x80);
  memcpy(&tmp,input + n_blocks * 0x40,(ulong)uVar1);
  pad(prev_len + input_len,(uint8_t *)((long)&tmp + (ulong)uVar1));
  Hacl_Hash_MD5_update_multi(s,(uint8_t *)&tmp,(uint)tmp_twoblocks._120_4_ >> 6);
  return;
}

Assistant:

void
Hacl_Hash_MD5_update_last(uint32_t *s, uint64_t prev_len, uint8_t *input, uint32_t input_len)
{
  uint32_t blocks_n = input_len / 64U;
  uint32_t blocks_len = blocks_n * 64U;
  uint8_t *blocks = input;
  uint32_t rest_len = input_len - blocks_len;
  uint8_t *rest = input + blocks_len;
  Hacl_Hash_MD5_update_multi(s, blocks, blocks_n);
  uint64_t total_input_len = prev_len + (uint64_t)input_len;
  uint32_t pad_len = 1U + (128U - (9U + (uint32_t)(total_input_len % (uint64_t)64U))) % 64U + 8U;
  uint32_t tmp_len = rest_len + pad_len;
  uint8_t tmp_twoblocks[128U] = { 0U };
  uint8_t *tmp = tmp_twoblocks;
  uint8_t *tmp_rest = tmp;
  uint8_t *tmp_pad = tmp + rest_len;
  memcpy(tmp_rest, rest, rest_len * sizeof (uint8_t));
  pad(total_input_len, tmp_pad);
  Hacl_Hash_MD5_update_multi(s, tmp, tmp_len / 64U);
}